

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

Float __thiscall
pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>::
MaxValue<pbrt::RGBGridMedium::RGBGridMedium(pbrt::Bounds3<float>const&,pbrt::Transform_const&,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>>,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
          (void *param_1,undefined8 param_2)

{
  Point3<float> p;
  Tuple3<pbrt::Point3,_float> t;
  Tuple3<pbrt::Point3,_float> t_00;
  Vector3<int> v;
  Tuple3<pbrt::Point3,_int> t2;
  Tuple3<pbrt::Point3,_int> t1;
  Tuple3<pbrt::Point3,_int> t1_00;
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Tuple3<pbrt::Point3,_int> TVar8;
  Point3<int> PVar9;
  int x;
  int y;
  int z;
  Float maxValue;
  Point3i pi [2];
  Point3f ps [2];
  float in_stack_fffffffffffffda8;
  float x_00;
  Point3<float> *in_stack_fffffffffffffdb0;
  Point3<int> *this;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 local_238 [8];
  undefined4 in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd4;
  float in_stack_fffffffffffffdd8;
  int local_224;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  float local_20c;
  undefined8 local_208;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe08;
  int local_1d4;
  undefined8 local_1b8;
  int local_1b0;
  Point3<int> local_13c;
  undefined8 local_130;
  int local_128;
  undefined8 local_120;
  int local_118;
  Tuple3<pbrt::Point3,_int> local_110;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_dc;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_74;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_4c;
  int local_44;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_18;
  void *local_10;
  undefined1 auVar4 [64];
  
  x_00 = 0.5;
  local_18 = param_2;
  local_10 = param_1;
  Point3<float>::Point3(in_stack_fffffffffffffdb0,0.5,in_stack_fffffffffffffda8,0.0);
  Point3<float>::Point3(in_stack_fffffffffffffdb0,x_00,in_stack_fffffffffffffda8,0.0);
  local_88 = local_30;
  local_90 = local_38;
  local_98 = local_30;
  local_a0 = local_38;
  auVar6 = ZEXT856(0);
  t.y = in_stack_fffffffffffffdd4;
  t.x = (float)in_stack_fffffffffffffdd0;
  t.z = in_stack_fffffffffffffdd8;
  PVar7 = Floor<pbrt::Point3,float>(t);
  local_b8 = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_c0 = vmovlpd_avx(auVar4._0_16_);
  PVar7.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)in_stack_fffffffffffffdc0;
  PVar7.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20)
  ;
  PVar7.super_Tuple3<pbrt::Point3,_float>.x = (float)((ulong)param_1 >> 0x20);
  local_b0 = local_c0;
  local_a8 = local_b8;
  local_80 = local_c0;
  local_78 = local_b8;
  Point3<int>::Point3<float>((Point3<int> *)0x90d6d2,PVar7);
  local_60 = local_6c;
  local_68 = local_74;
  Point3<int>::Point3((Point3<int> *)in_stack_fffffffffffffdb0,(int)x_00,
                      (int)in_stack_fffffffffffffda8,0);
  local_c8 = local_d4;
  local_d0 = local_dc;
  local_e8 = local_60;
  local_f0 = local_68;
  local_f8 = local_d4;
  local_100 = local_dc;
  t1.y = in_stack_fffffffffffffe04;
  t1.x = in_stack_fffffffffffffe00;
  t1.z = in_stack_fffffffffffffe08;
  TVar8.y = in_stack_fffffffffffffde4;
  TVar8.x = in_stack_fffffffffffffde0;
  TVar8.z = in_stack_fffffffffffffde8;
  TVar8 = (Tuple3<pbrt::Point3,_int>)Max<pbrt::Point3,int>(t1,TVar8);
  local_110.z = TVar8.z;
  local_50 = local_110.z;
  local_110._0_8_ = TVar8._0_8_;
  local_58._0_4_ = local_110.x;
  local_58._4_4_ = local_110.y;
  auVar6 = ZEXT856(0);
  t_00.y = in_stack_fffffffffffffdd4;
  t_00.x = (float)in_stack_fffffffffffffdd0;
  t_00.z = in_stack_fffffffffffffdd8;
  local_110 = TVar8;
  PVar7 = Floor<pbrt::Point3,float>(t_00);
  auVar5._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  vmovlpd_avx(auVar5._0_16_);
  this = &local_13c;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)in_stack_fffffffffffffdc0;
  p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)((ulong)param_1 >> 0x20);
  Point3<int>::Point3<float>((Point3<int> *)0x90d872,p);
  Vector3<int>::Vector3((Vector3<int> *)this,(int)x_00,(int)in_stack_fffffffffffffda8,0);
  v.super_Tuple3<pbrt::Vector3,_int>.y = (int)in_stack_fffffffffffffdd4;
  v.super_Tuple3<pbrt::Vector3,_int>.x = in_stack_fffffffffffffdd0;
  v.super_Tuple3<pbrt::Vector3,_int>.z = (int)in_stack_fffffffffffffdd8;
  PVar9 = Point3<int>::operator+((Point3<int> *)param_1,v);
  local_1b0 = PVar9.super_Tuple3<pbrt::Point3,_int>.z;
  local_128 = local_1b0;
  local_1b8 = PVar9.super_Tuple3<pbrt::Point3,_int>._0_8_;
  local_130 = local_1b8;
  local_118 = local_1b0;
  local_120 = local_1b8;
  Point3<int>::Point3(this,(int)x_00,(int)in_stack_fffffffffffffda8,0);
  t1_00.y = in_stack_fffffffffffffe04;
  t1_00.x = in_stack_fffffffffffffe00;
  t1_00.z = local_1d4;
  t2.y = in_stack_fffffffffffffde4;
  t2.x = in_stack_fffffffffffffde0;
  t2.z = in_stack_fffffffffffffde8;
  PVar9 = Min<pbrt::Point3,int>(t1_00,t2);
  local_208 = PVar9.super_Tuple3<pbrt::Point3,_int>._0_8_;
  local_44 = PVar9.super_Tuple3<pbrt::Point3,_int>.z;
  local_4c = local_208;
  local_20c = Lookup<pbrt::RGBGridMedium::RGBGridMedium(pbrt::Bounds3<float>const&,pbrt::Transform_const&,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>>,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
                        ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)param_1,&stack0xfffffffffffffde8
                        );
  for (iVar2 = local_50; iVar2 <= local_44; iVar2 = iVar2 + 1) {
    for (local_224 = local_58._4_4_; local_224 <= local_4c._4_4_; local_224 = local_224 + 1) {
      for (iVar1 = (int)local_58; iVar1 <= (int)local_4c; iVar1 = iVar1 + 1) {
        Point3<int>::Point3(this,(int)x_00,(int)in_stack_fffffffffffffda8,0);
        Lookup<pbrt::RGBGridMedium::RGBGridMedium(pbrt::Bounds3<float>const&,pbrt::Transform_const&,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,float,pstd::optional<pbrt::SampledGrid<pbrt::RGBIlluminantSpectrum>>,float,pstd::pmr::polymorphic_allocator<std::byte>)::__0>
                  ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)param_1,local_238);
        pfVar3 = std::max<float>(&local_20c,(float *)&stack0xfffffffffffffdd4);
        local_20c = *pfVar3;
      }
    }
  }
  return local_20c;
}

Assistant:

Float MaxValue(const Bounds3f &bounds, F convert) const {
        Point3f ps[2] = {Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                                 bounds.pMin.z * nz - .5f),
                         Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                                 bounds.pMax.z * nz - .5f)};
        Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                         Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                             Point3i(nx - 1, ny - 1, nz - 1))};

        Float maxValue = Lookup(Point3i(pi[0]), convert);
        for (int z = pi[0].z; z <= pi[1].z; ++z)
            for (int y = pi[0].y; y <= pi[1].y; ++y)
                for (int x = pi[0].x; x <= pi[1].x; ++x)
                    maxValue = std::max(maxValue, Lookup(Point3i(x, y, z), convert));

        return maxValue;
    }